

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O3

void __thiscall
google::protobuf::RepeatedField<long>::InternalSwap
          (RepeatedField<long> *this,RepeatedField<long> *other)

{
  void *pvVar1;
  void *pvVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  LogMessage *pLVar6;
  long *plVar7;
  void **ppvVar8;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (this == other) {
    internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "src/../third_party/protobuf-lite/google/protobuf/repeated_field.h",0x5b3);
    pLVar6 = internal::LogMessage::operator<<(&local_50,"CHECK failed: this != other: ");
    internal::LogFinisher::operator=(&local_51,pLVar6);
    internal::LogMessage::~LogMessage(&local_50);
  }
  if (this->total_size_ == 0) {
    ppvVar8 = &this->arena_or_elements_;
  }
  else {
    plVar7 = elements(this);
    ppvVar8 = (void **)(plVar7 + -1);
  }
  pvVar1 = *ppvVar8;
  if (other->total_size_ == 0) {
    ppvVar8 = &other->arena_or_elements_;
  }
  else {
    plVar7 = elements(other);
    ppvVar8 = (void **)(plVar7 + -1);
  }
  if (pvVar1 != *ppvVar8) {
    internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "src/../third_party/protobuf-lite/google/protobuf/repeated_field.h",0x5b4);
    pLVar6 = internal::LogMessage::operator<<
                       (&local_50,"CHECK failed: GetArena() == other->GetArena(): ");
    internal::LogFinisher::operator=(&local_51,pLVar6);
    internal::LogMessage::~LogMessage(&local_50);
  }
  iVar4 = this->current_size_;
  iVar5 = this->total_size_;
  pvVar1 = this->arena_or_elements_;
  iVar3 = other->total_size_;
  pvVar2 = other->arena_or_elements_;
  this->current_size_ = other->current_size_;
  this->total_size_ = iVar3;
  this->arena_or_elements_ = pvVar2;
  other->current_size_ = iVar4;
  other->total_size_ = iVar5;
  other->arena_or_elements_ = pvVar1;
  return;
}

Assistant:

inline void RepeatedField<Element>::InternalSwap(RepeatedField* other) {
  GOOGLE_DCHECK(this != other);
  GOOGLE_DCHECK(GetArena() == other->GetArena());

  // Swap all fields at once.
  static_assert(std::is_standard_layout<RepeatedField<Element>>::value,
                "offsetof() requires standard layout before c++17");
  internal::memswap<offsetof(RepeatedField, arena_or_elements_) +
                    sizeof(this->arena_or_elements_) -
                    offsetof(RepeatedField, current_size_)>(
      reinterpret_cast<char*>(this) + offsetof(RepeatedField, current_size_),
      reinterpret_cast<char*>(other) + offsetof(RepeatedField, current_size_));
}